

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O3

double l1Norm_V(Vector *V)

{
  LASErrIdType LVar1;
  ulong uVar2;
  double local_10;
  
  V_Lock(V);
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    if (V->Dim == 0) {
      local_10 = 0.0;
    }
    else {
      local_10 = 0.0;
      uVar2 = 1;
      do {
        local_10 = local_10 + ABS(V->Cmp[uVar2]);
        uVar2 = uVar2 + 1;
      } while (uVar2 <= V->Dim);
    }
    local_10 = local_10 * V->Multipl;
  }
  else {
    local_10 = 1.0;
  }
  V_Unlock(V);
  return local_10;
}

Assistant:

double l1Norm_V(Vector *V)
/* SRes = l1-Norm of the vector V */
{
    double SRes;

    double Sum;
    size_t Dim, Ind;
    Real *VCmp;

    V_Lock(V);
    
    if (LASResult() == LASOK) {
        Dim = V->Dim;
        VCmp = V->Cmp;
        Sum = 0.0;
        for_AllCmp
           Sum += fabs(VCmp[Ind]);
        Sum *= V->Multipl;
        SRes = Sum;
    } else {
        SRes = 1.0;
    }

    V_Unlock(V);

    return(SRes);
}